

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

bool __thiscall cmUVProcessChain::Wait(cmUVProcessChain *this,uint64_t milliseconds)

{
  uint uVar1;
  byte bVar2;
  pointer pIVar3;
  _func_void_uv_timer_t_ptr *cb;
  size_type sVar4;
  bool bVar5;
  __0 local_3d [13];
  undefined1 local_30 [8];
  uv_timer_ptr timer;
  bool timeout;
  uint64_t milliseconds_local;
  cmUVProcessChain *this_local;
  
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  ::cm::uv_timer_ptr::uv_timer_ptr((uv_timer_ptr *)local_30);
  if (milliseconds != 0) {
    pIVar3 = std::
             unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
             ::operator->(&this->Data);
    ::cm::uv_timer_ptr::init((uv_timer_ptr *)local_30,(EVP_PKEY_CTX *)pIVar3->Loop);
    cb = Wait(unsigned_long)::$_0::operator_cast_to_function_pointer(local_3d);
    ::cm::uv_timer_ptr::start((uv_timer_ptr *)local_30,cb,milliseconds,0);
  }
  while( true ) {
    bVar5 = false;
    if ((timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
         super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1) ==
        0) {
      pIVar3 = std::
               unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
               ::operator->(&this->Data);
      uVar1 = pIVar3->ProcessesCompleted;
      pIVar3 = std::
               unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
               ::operator->(&this->Data);
      sVar4 = std::
              vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
              ::size(&pIVar3->Processes);
      bVar5 = uVar1 < sVar4;
    }
    if (!bVar5) break;
    pIVar3 = std::
             unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
             ::operator->(&this->Data);
    uv_run(pIVar3->Loop,UV_RUN_ONCE);
  }
  bVar2 = timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
          super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ ^ 0xff;
  ::cm::uv_timer_ptr::~uv_timer_ptr((uv_timer_ptr *)local_30);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmUVProcessChain::Wait(uint64_t milliseconds)
{
  bool timeout = false;
  cm::uv_timer_ptr timer;

  if (milliseconds > 0) {
    timer.init(*this->Data->Loop, &timeout);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timeoutPtr = static_cast<bool*>(handle->data);
        *timeoutPtr = true;
      },
      milliseconds, 0);
  }

  while (!timeout &&
         this->Data->ProcessesCompleted < this->Data->Processes.size()) {
    uv_run(this->Data->Loop, UV_RUN_ONCE);
  }

  return !timeout;
}